

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmenu.cpp
# Opt level: O2

void __thiscall
FListMenuItemText::FListMenuItemText
          (FListMenuItemText *this,int x,int y,int height,int hotkey,char *text,FFont *font,
          EColorRange color,EColorRange color2,FName *child,int param)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = child->Index;
  (this->super_FListMenuItemSelectable).super_FListMenuItem.mXpos = x;
  (this->super_FListMenuItemSelectable).super_FListMenuItem.mYpos = y;
  (this->super_FListMenuItemSelectable).super_FListMenuItem.mAction.Index = iVar1;
  (this->super_FListMenuItemSelectable).super_FListMenuItem.mEnabled = true;
  (this->super_FListMenuItemSelectable).mHeight = height;
  (this->super_FListMenuItemSelectable).mParam = param;
  (this->super_FListMenuItemSelectable).mHotkey = 0;
  (this->super_FListMenuItemSelectable).super_FListMenuItem._vptr_FListMenuItem =
       (_func_int **)&PTR__FListMenuItemText_006e79d0;
  pcVar2 = ncopystring(text);
  this->mText = pcVar2;
  this->mFont = font;
  this->mColor = color;
  this->mColorSelected = color2;
  (this->super_FListMenuItemSelectable).mHotkey = hotkey;
  return;
}

Assistant:

FListMenuItemText::FListMenuItemText(int x, int y, int height, int hotkey, const char *text, FFont *font, EColorRange color, EColorRange color2, FName child, int param)
: FListMenuItemSelectable(x, y, height, child, param)
{
	mText = ncopystring(text);
	mFont = font;
	mColor = color;
	mColorSelected = color2;
	mHotkey = hotkey;
}